

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::ClearOneofField
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  OneofDescriptor *oneof_descriptor;
  
  bVar1 = HasOneofField(this,message,field);
  if (bVar1) {
    oneof_descriptor = FieldDescriptor::containing_oneof(field);
    ClearOneof(this,message,oneof_descriptor);
    return;
  }
  return;
}

Assistant:

void Reflection::ClearOneofField(Message* message,
                                 const FieldDescriptor* field) const {
  if (HasOneofField(*message, field)) {
    ClearOneof(message, field->containing_oneof());
  }
}